

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferImageTypeCase::checkRequirements
          (TextureBufferImageTypeCase *this)

{
  ContextInfo *pCVar1;
  int iVar2;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pCVar1 = ((this->super_BaseTypeCase).super_TestCase.m_context)->m_contextInfo;
  iVar2 = (*pCVar1->_vptr_ContextInfo[2])(pCVar1,0x90ce);
  if (0 < iVar2) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Test requires fragment images",&local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferImageTypeCase::checkRequirements (void) const
{
	if (m_context.getContextInfo().getInt(GL_MAX_FRAGMENT_IMAGE_UNIFORMS) < 1)
		throw tcu::NotSupportedError("Test requires fragment images");
}